

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printT2AddrModeImm0_1020s4Operand(MCInst *MI,uint OpNum,SStream *O)

{
  uint uVar1;
  int iVar2;
  MCOperand *op;
  MCOperand *op_00;
  int64_t iVar3;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint tmp;
  MCOperand *MO2;
  MCOperand *MO1;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  MCInst *in_stack_ffffffffffffffc0;
  MCInst *MI_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  op_00 = MCInst_getOperand(in_RDI,in_ESI + 1);
  SStream_concat0((SStream *)in_stack_ffffffffffffffc0,
                  (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  set_mem_access(in_stack_ffffffffffffffc0,SUB41(in_stack_ffffffffffffffbc >> 0x18,0));
  MI_00 = (MCInst *)in_RDI->csh;
  MCOperand_getReg(op);
  printRegName((cs_struct *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDX,
               (uint)((ulong)MI_00 >> 0x20));
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    uVar1 = MCOperand_getReg(op);
    *(uint *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar1;
  }
  iVar3 = MCOperand_getImm(op_00);
  if (iVar3 != 0) {
    SStream_concat0((SStream *)MI_00,
                    (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    iVar3 = MCOperand_getImm(op_00);
    iVar2 = (int)iVar3 << 2;
    printUInt32Bang((SStream *)MI_00,in_stack_ffffffffffffffbc);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      *(int *)(in_RDI->flat_insn->detail->groups +
              (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x51) = iVar2;
    }
  }
  SStream_concat0((SStream *)MI_00,
                  (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  set_mem_access(MI_00,SUB41(in_stack_ffffffffffffffbc >> 0x18,0));
  return;
}

Assistant:

static void printT2AddrModeImm0_1020s4Operand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	unsigned tmp;

	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
	if (MCOperand_getImm(MO2)) {
		SStream_concat0(O, ", ");
		tmp = (unsigned int)MCOperand_getImm(MO2) * 4;
		printUInt32Bang(O, tmp);
		if (MI->csh->detail)
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = tmp;
	}
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}